

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O1

int __thiscall FWeaponSlots::RestoreSlots(FWeaponSlots *this,FConfigFile *config,char *section)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FString section_name;
  char *value;
  char *key;
  FString local_50;
  FWeaponSlots *local_48;
  char *local_40;
  char *local_38;
  
  FString::FString(&local_50,section);
  FString::operator+=(&local_50,".Weapons");
  iVar4 = 0;
  bVar2 = FConfigFile::SetSection(config,local_50.Chars,false);
  if (bVar2) {
    iVar4 = 0;
    local_48 = this;
    while( true ) {
      bVar2 = FConfigFile::NextInSection(config,&local_38,&local_40);
      pcVar1 = local_38;
      if (!bVar2) break;
      iVar3 = strncasecmp(local_38,"Slot[",5);
      if ((((iVar3 == 0) && (0xf4 < (byte)(pcVar1[5] - 0x3bU))) && (pcVar1[6] == ']')) &&
         (pcVar1[7] == '\0')) {
        FWeaponSlot::AddWeaponList(local_48->Slots + (byte)(pcVar1[5] - 0x30),local_40,true);
        iVar4 = iVar4 + 1;
      }
    }
  }
  FString::~FString(&local_50);
  return iVar4;
}

Assistant:

int FWeaponSlots::RestoreSlots(FConfigFile *config, const char *section)
{
	FString section_name(section);
	const char *key, *value;
	int slotsread = 0;

	section_name += ".Weapons";
	if (!config->SetSection(section_name))
	{
		return 0;
	}
	while (config->NextInSection (key, value))
	{
		if (strnicmp (key, "Slot[", 5) != 0 ||
			key[5] < '0' ||
			key[5] > '0'+NUM_WEAPON_SLOTS ||
			key[6] != ']' ||
			key[7] != 0)
		{
			continue;
		}
		Slots[key[5] - '0'].AddWeaponList(value, true);
		slotsread++;
	}
	return slotsread;
}